

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_info.cpp
# Opt level: O3

void __thiscall duckdb::AlterInfo::~AlterInfo(AlterInfo *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

AlterInfo::~AlterInfo() {
}